

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

Attribute * prvTidyCheckAttribute(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  Attribute *pAVar1;
  uint vers;
  Attribute *attribute;
  AttVal *attval_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pAVar1 = attval->dict;
  if (pAVar1 != (Attribute *)0x0) {
    if (((((attval != (AttVal *)0x0) && (attval->dict != (Attribute *)0x0)) &&
         (attval->dict->id == TidyAttr_XML_LANG)) ||
        (((attval != (AttVal *)0x0 && (attval->dict != (Attribute *)0x0)) &&
         (attval->dict->id == TidyAttr_XML_SPACE)))) &&
       (doc->lexer->isvoyager = yes, (int)(doc->config).value[0x21].v == 0)) {
      prvTidySetOptionBool(doc,TidyXhtmlOut,yes);
      prvTidySetOptionBool(doc,TidyXmlOut,yes);
    }
    vers = AttributeVersions(node,attval);
    prvTidyConstrainVersion(doc,vers);
    if (pAVar1->attrchk != (AttrCheck *)0x0) {
      (*pAVar1->attrchk)(doc,node,attval);
    }
  }
  return pAVar1;
}

Assistant:

const Attribute* TY_(CheckAttribute)( TidyDocImpl* doc, Node *node, AttVal *attval )
{
    const Attribute* attribute = attval->dict;

    if ( attribute != NULL )
    {
        if (attrIsXML_LANG(attval) || attrIsXML_SPACE(attval))
        {
            doc->lexer->isvoyager = yes;
            if (!cfgBool(doc, TidyHtmlOut))
            {
                TY_(SetOptionBool)(doc, TidyXhtmlOut, yes);
                TY_(SetOptionBool)(doc, TidyXmlOut, yes);
            }
        }

        TY_(ConstrainVersion)(doc, AttributeVersions(node, attval));
        
        if (attribute->attrchk)
            attribute->attrchk( doc, node, attval );
    }

    return attribute;
}